

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
                   *this,arrays_type *new_arrays_)

{
  size_t sVar1;
  size_t sVar2;
  anon_class_8_1_8991fb9c in_RSI;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
  *in_RDI;
  size_t num_destroyed;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
  *this_00;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
  *this_01;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  anon_class_24_3_45a051ed in_stack_ffffffffffffffb0;
  size_t local_18;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
  *local_10;
  
  local_18 = 0;
  this_01 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
             *)&stack0xffffffffffffffe8;
  this_00 = in_RDI;
  local_10 = in_RSI.this;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::DefinitionSymbol_const*,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<std::pair<slang::ast::DefinitionSymbol_const*const,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>>>
  ::
  for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::DefinitionSymbol_const*,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<std::pair<slang::ast::DefinitionSymbol_const*const,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>>>::unchecked_rehash(boost::unordered::detail::foa::table_arrays<std::pair<slang::ast::DefinitionSymbol_const*const,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::pow2_size_policy,std::allocator<std::pair<slang::ast::DefinitionSymbol_const*const,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>>>&)::_lambda(std::pair<slang::ast::DefinitionSymbol_const*const,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>*)_1_>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0);
  sVar2 = local_18;
  sVar1 = size(in_RDI);
  if (sVar2 != sVar1) {
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::DefinitionSymbol_const*,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<std::pair<slang::ast::DefinitionSymbol_const*const,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>>>
    ::
    for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::DefinitionSymbol_const*,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<std::pair<slang::ast::DefinitionSymbol_const*const,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>>>::unchecked_rehash(boost::unordered::detail::foa::table_arrays<std::pair<slang::ast::DefinitionSymbol_const*const,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::pow2_size_policy,std::allocator<std::pair<slang::ast::DefinitionSymbol_const*const,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>>>&)::_lambda(std::pair<slang::ast::DefinitionSymbol_const*const,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>*)_3_>
              (this_00,in_RSI);
  }
  delete_arrays(in_RSI.this,&this_00->arrays);
  (in_RDI->arrays).groups_size_index = (local_10->arrays).groups_size_index;
  (in_RDI->arrays).groups_size_mask = (local_10->arrays).groups_size_mask;
  (in_RDI->arrays).groups_ = (local_10->arrays).groups_;
  (in_RDI->arrays).elements_ = (local_10->arrays).elements_;
  sVar2 = initial_max_load(this_01);
  (in_RDI->size_ctrl).ml = sVar2;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }